

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Colored.cpp
# Opt level: O0

bool __thiscall Colored::setRGB(Colored *this,int color,int *rgb)

{
  bool local_21;
  bool flag;
  int *rgb_local;
  int color_local;
  Colored *this_local;
  
  local_21 = true;
  if (color == -1) {
    *rgb = 0x99;
    rgb[1] = 0xcc;
    rgb[2] = 0xff;
  }
  else if (color == 0) {
    *rgb = 0xff;
    rgb[1] = 0xff;
    rgb[2] = 0xff;
  }
  else if (color == 1) {
    *rgb = 0xff;
    rgb[1] = 0x99;
    rgb[2] = 0x99;
  }
  else if (color == 100) {
    *rgb = 0xff;
    rgb[1] = 0xfa;
    rgb[2] = 0xf0;
  }
  else {
    if (color == 0x65) {
      *rgb = 0;
      rgb[1] = 0;
      rgb[2] = 0;
    }
    local_21 = false;
  }
  return local_21;
}

Assistant:

bool Colored::setRGB(int color, int rgb[]){
    bool flag = true;
    switch (color) {
        case -1:
            rgb[0] = 153;   rgb[1] = 204;   rgb[2] = 255; //blue
            break;
        case 0:
            rgb[0] = 255;   rgb[1] = 255;   rgb[2] = 255; //white
            break;
        case 1:
            rgb[0] = 255;   rgb[1] = 153;   rgb[2] = 153; //red
            break;
        case 100:
            rgb[0] = 255;   rgb[1] = 250;   rgb[2] = 240; //gray
            break;
        case 101:
            rgb[0] = 0;     rgb[1] = 0;     rgb[2] = 0;   //black
        default:
            flag = false;
            break;
    }
    return flag;
}